

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

string * __thiscall LogEvent::handleEvent_abi_cxx11_(string *__return_storage_ptr__,LogEvent *this)

{
  tm *__tp;
  size_t sVar1;
  Level in_EDX;
  string level;
  char timeString [64];
  char str [2048];
  
  LogLevel::ToString_abi_cxx11_(&level,(LogLevel *)(ulong)this->m_level,in_EDX);
  __tp = gmtime(&this->m_time);
  __tp->tm_hour = __tp->tm_hour + 8;
  strftime(timeString,0x40,"[%Y-%m-%d] [%H:%M:%S]",__tp);
  snprintf(str,0x800,"[%lu] %s [%s] [%u] [%s] [%u] [%s]\r\n",this->m_time,timeString,
           level._M_dataplus._M_p,(ulong)this->m_threadId,(this->m_funName)._M_dataplus._M_p,
           (ulong)this->m_line,(this->m_content)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(str);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,str,str + sVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)level._M_dataplus._M_p != &level.field_2) {
    operator_delete(level._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LogEvent::handleEvent()
{
	char str[MAXSIZE],timeString[64];
	std::string level=LogLevel::ToString(m_level);
	struct tm* timeStruct=gmtime(&m_time);
	timeStruct->tm_hour+=8;
	strftime(timeString,64,"[%Y-%m-%d] [%H:%M:%S]",timeStruct);
	snprintf(str,MAXSIZE,"[%lu] %s [%s] [%u] [%s] [%u] [%s]\r\n",m_time,timeString,level.data(),m_threadId,m_funName.data(),m_line,m_content.data());
	return std::string(str);
}